

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * get_METAL_const_array_varname(Context *ctx,int base,int size)

{
  size_t sVar1;
  char *__dest;
  char buf [64];
  char acStack_58 [72];
  
  snprintf(acStack_58,0x40,"const_array_%d_%d",base,(ulong)(uint)size);
  sVar1 = strlen(acStack_58);
  __dest = (char *)(*ctx->malloc)((int)sVar1 + 1,ctx->malloc_data);
  if (__dest == (char *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    strcpy(__dest,acStack_58);
  }
  return __dest;
}

Assistant:

static const char *get_METAL_const_array_varname(Context *ctx, int base, int size)
{
    char buf[64];
    get_METAL_const_array_varname_in_buf(ctx, base, size, buf, sizeof (buf));
    return StrDup(ctx, buf);
}